

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoUnits.c
# Opt level: O2

void reoUnitsAddUnitToPlane(reo_plane *pPlane,reo_unit *pUnit)

{
  reo_unit *prVar1;
  
  prVar1 = pPlane->pHead;
  pPlane->pHead = pUnit;
  pUnit->Next = prVar1;
  pPlane->statsNodes = pPlane->statsNodes + 1;
  return;
}

Assistant:

void reoUnitsAddUnitToPlane( reo_plane * pPlane, reo_unit * pUnit )
{
	if ( pPlane->pHead == NULL )
	{
		pPlane->pHead = pUnit;
		pUnit->Next   = NULL;
	}
	else
	{
		pUnit->Next   = pPlane->pHead;
		pPlane->pHead = pUnit;
	}
	pPlane->statsNodes++;
}